

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveJSON.h
# Opt level: O0

void __thiscall
chrono::ChArchiveOutJSON::ChArchiveOutJSON(ChArchiveOutJSON *this,ChStreamOutAsciiFile *mostream)

{
  value_type local_29;
  value_type local_28 [4];
  ChStreamOutAsciiFile *local_18;
  ChStreamOutAsciiFile *mostream_local;
  ChArchiveOutJSON *this_local;
  
  local_18 = mostream;
  mostream_local = (ChStreamOutAsciiFile *)this;
  ChArchiveOut::ChArchiveOut(&this->super_ChArchiveOut);
  (this->super_ChArchiveOut).super_ChArchive._vptr_ChArchive =
       (_func_int **)&PTR__ChArchiveOutJSON_001d7308;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)&this->nitems);
  std::stack<bool,std::deque<bool,std::allocator<bool>>>::
  stack<std::deque<bool,std::allocator<bool>>,void>
            ((stack<bool,std::deque<bool,std::allocator<bool>>> *)&this->is_array);
  this->ostream = local_18;
  chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"{ ");
  *(int *)&(this->super_ChArchiveOut).field_0x104 =
       *(int *)&(this->super_ChArchiveOut).field_0x104 + 1;
  *(undefined4 *)&(this->super_ChArchiveOut).field_0x104 = 1;
  local_28[0] = 0;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push(&this->nitems,local_28);
  local_29 = false;
  std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::push(&this->is_array,&local_29);
  return;
}

Assistant:

ChArchiveOutJSON( ChStreamOutAsciiFile& mostream) {
          ostream = &mostream;
          
          (*ostream) << "{ ";
          ++tablevel;

          tablevel = 1;
          nitems.push(0);
          is_array.push(false);
      }